

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::QWizard(QWizard *this,QWidget *parent,WindowFlags flags)

{
  EVP_PKEY_CTX *ctx;
  QWizardPrivate *this_00;
  undefined4 in_EDX;
  QWizardPrivate *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QDialog *unaff_retaddr;
  QFlagsStorage<Qt::WindowType> in_stack_0000000c;
  QWizardPrivate *d;
  QDialogPrivate *dd;
  
  dd = *(QDialogPrivate **)(in_FS_OFFSET + 0x28);
  ctx = (EVP_PKEY_CTX *)operator_new(0x4e0);
  QWizardPrivate::QWizardPrivate(in_RSI);
  QDialog::QDialog(unaff_retaddr,dd,(QWidget *)CONCAT44(in_EDX,in_EDX),
                   (WindowFlags)in_stack_0000000c.i);
  *in_RDI = &PTR_metaObject_00d26600;
  in_RDI[2] = &PTR__QWizard_00d267f8;
  this_00 = d_func((QWizard *)0x7ba368);
  QWizardPrivate::init(this_00,ctx);
  if (*(QDialogPrivate **)(in_FS_OFFSET + 0x28) == dd) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizard::QWizard(QWidget *parent, Qt::WindowFlags flags)
    : QDialog(*new QWizardPrivate, parent, flags)
{
    Q_D(QWizard);
    d->init();
}